

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O0

void eliminate_et_next_to_en(BidiContext *ctx)

{
  size_t sVar1;
  bool bVar2;
  _Bool _Var3;
  size_t sVar4;
  BidiType t_1;
  size_t i_1;
  size_t c_1;
  BidiType t;
  size_t i;
  size_t c;
  _Bool modifying;
  BidiContext *ctx_local;
  
  bVar2 = false;
  for (i = 0; i < ctx->irslen; i = i + 1) {
    sVar4 = ctx->irs[i];
    if (ctx->types[sVar4] == EN) {
      bVar2 = true;
    }
    else if ((bVar2) && (_Var3 = typeIsETOrBN(ctx->types[sVar4]), _Var3)) {
      ctx->types[sVar4] = EN;
    }
    else {
      bVar2 = false;
    }
  }
  i_1 = ctx->irslen;
  while (sVar4 = i_1 - 1, i_1 != 0) {
    sVar1 = ctx->irs[sVar4];
    i_1 = sVar4;
    if (ctx->types[sVar1] == EN) {
      bVar2 = true;
    }
    else if ((bVar2) && (_Var3 = typeIsETOrBN(ctx->types[sVar1]), _Var3)) {
      ctx->types[sVar1] = EN;
    }
    else {
      bVar2 = false;
    }
  }
  return;
}

Assistant:

static void eliminate_et_next_to_en(BidiContext *ctx)
{
    /* Rule W5: a sequence of ET adjacent to an EN take the type EN.
     * This is easiest to implement with one loop in each direction.
     *
     * Section 5.2 adjustment: include BN with ET. (We don't need to
     * #ifdef that out, because in the standard algorithm, we won't
     * have any BN left in any case.) */

    bool modifying = false;

    for (size_t c = 0; c < ctx->irslen; c++) {
        size_t i = ctx->irs[c];
        BidiType t = ctx->types[i];
        if (t == EN) {
            modifying = true;
        } else if (modifying && typeIsETOrBN(t)) {
            ctx->types[i] = EN;
        } else {
            modifying = false;
        }
    }

    for (size_t c = ctx->irslen; c-- > 0 ;) {
        size_t i = ctx->irs[c];
        BidiType t = ctx->types[i];
        if (t == EN) {
            modifying = true;
        } else if (modifying && typeIsETOrBN(t)) {
            ctx->types[i] = EN;
        } else {
            modifying = false;
        }
    }
}